

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

void mi_os_prim_free(void *addr,size_t size,size_t commit_size)

{
  uint uVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int err;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if ((in_RDI != 0) && (in_RSI != 0)) {
    uVar1 = _mi_prim_free((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffd8);
    if (uVar1 != 0) {
      _mi_warning_message("unable to free OS memory (error: %d (0x%x), size: 0x%zx bytes, address: %p)\n"
                          ,(ulong)uVar1,(ulong)uVar1,in_RSI,in_RDI);
    }
    if (in_RDX != 0) {
      _mi_stat_decrease((mi_stat_count_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffd8);
    }
    _mi_stat_decrease((mi_stat_count_t *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void mi_os_prim_free(void* addr, size_t size, size_t commit_size) {
  mi_assert_internal((size % _mi_os_page_size()) == 0);
  if (addr == NULL || size == 0) return; // || _mi_os_is_huge_reserved(addr)
  int err = _mi_prim_free(addr, size);
  if (err != 0) {
    _mi_warning_message("unable to free OS memory (error: %d (0x%x), size: 0x%zx bytes, address: %p)\n", err, err, size, addr);
  }
  if (commit_size > 0) {
    mi_os_stat_decrease(committed, commit_size);
  }
  mi_os_stat_decrease(reserved, size);
}